

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

sexp_conflict
json_write_array(sexp_conflict ctx,sexp_conflict self,sexp_conflict obj,sexp_conflict out)

{
  sexp psVar1;
  int iVar2;
  sexp_conflict psVar3;
  sexp_conflict in_RCX;
  sexp_conflict in_RDX;
  sexp_conflict in_RSI;
  sexp_conflict in_RDI;
  int i;
  int len;
  sexp_conflict tmp;
  int local_38;
  sexp_conflict local_8;
  
  iVar2 = (int)(in_RDX->value).vector.length;
  if ((in_RCX->value).type.setters == (sexp)0x0) {
    fputs("[",(FILE *)(in_RCX->value).type.getters);
  }
  else {
    sexp_buffered_write_string(in_RDI,"[",in_RCX);
  }
  local_38 = 0;
  while( true ) {
    if (iVar2 <= local_38) {
      if ((in_RCX->value).type.setters == (sexp)0x0) {
        fputs("]",(FILE *)(in_RCX->value).type.getters);
      }
      else {
        sexp_buffered_write_string(in_RDI,"]",in_RCX);
      }
      local_8 = (sexp_conflict)&DAT_0000043e;
      return local_8;
    }
    psVar3 = json_write(in_RDI,in_RSI,in_RDX,in_RCX);
    if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 0x13)) break;
    if (local_38 < iVar2 + -1) {
      if ((in_RCX->value).type.setters == (sexp)0x0) {
        putc(0x2c,(FILE *)(in_RCX->value).type.getters);
      }
      else if ((in_RCX->value).type.print < (sexp)(in_RCX->value).port.size) {
        psVar1 = (in_RCX->value).type.print;
        (in_RCX->value).type.print = (sexp)((long)&psVar1->tag + 1);
        *(undefined1 *)((long)&psVar1->tag + (long)&((in_RCX->value).type.setters)->tag) = 0x2c;
      }
      else {
        sexp_buffered_write_char(in_RDI,0x2c,in_RCX);
      }
    }
    local_38 = local_38 + 1;
  }
  return psVar3;
}

Assistant:

sexp json_write_array(sexp ctx, sexp self, const sexp obj, sexp out) {
  sexp tmp;
  int len = sexp_vector_length(obj), i;
  sexp_write_string(ctx, "[", out);
  for (i = 0; i < len; ++i) {
    tmp = json_write(ctx, self, sexp_vector_ref(obj, sexp_make_fixnum(i)), out);
    if (sexp_exceptionp(tmp)) {
      return tmp;
    }
    if (i < len - 1) {
      sexp_write_char(ctx, ',', out);
    }
  }
  sexp_write_string(ctx, "]", out);
  return SEXP_VOID;
}